

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  LogMessage *other;
  long lVar5;
  int out_size;
  void *out;
  int local_6c;
  LogMessage local_68;
  
  if (size < this->buffer_size_) {
    iVar3 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                      (this,&local_68,&local_6c);
    cVar1 = (char)iVar3;
    if (cVar1 != '\0') {
      if (local_6c < size) {
        do {
          memcpy((void *)local_68._0_8_,data,(long)local_6c);
          iVar3 = local_6c;
          lVar5 = (long)local_6c;
          iVar4 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                            (this,&local_68,&local_6c);
          cVar1 = (char)iVar4;
          if (cVar1 == '\0') {
            return false;
          }
          data = (void *)((long)data + lVar5);
          size = size - iVar3;
        } while (local_6c < size);
      }
      memcpy((void *)local_68._0_8_,data,(long)size);
      (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                (this,(ulong)(uint)(local_6c - size));
    }
  }
  else {
    bVar2 = WriteBuffer(this);
    if ((bVar2) &&
       (iVar3 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,data,(ulong)(uint)size), (char)iVar3 != '\0')) {
      if (this->buffer_used_ != 0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                   ,0x15e);
        other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (buffer_used_) == (0): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_6c,other);
        internal::LogMessage::~LogMessage(&local_68);
      }
      this->position_ = this->position_ + (long)size;
      return true;
    }
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    GOOGLE_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      return true;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}